

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper4.cpp
# Opt level: O3

void test_static_create_open_close_all(planck_unit_test_t *tc)

{
  ion_dictionary_config_info_t config;
  ion_dictionary_config_info_t config_00;
  ion_dictionary_config_info_t config_01;
  ion_dictionary_config_info_t config_02;
  ion_dictionary_config_info_t config_03;
  planck_unit_result_t pVar1;
  Dictionary<int,_int> *pDVar2;
  
  pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
  config.type = key_type_numeric_signed;
  config.key_size = 4;
  config.id = 1;
  config.use_type = '\0';
  config._5_3_ = 0;
  config.value_size = 4;
  config.dictionary_size = 100;
  config.dictionary_type = dictionary_type_bpp_tree_t;
  config.dictionary_status = '\0';
  config._29_3_ = 0;
  BppTree<int,_int>::BppTree((BppTree<int,_int> *)pDVar2,config);
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,0,(int)(pDVar2->dict).status,0x303,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                    );
  if (pVar1 != '\0') {
    cpp_wrapper_static_open_close(tc,pDVar2,0x42,0xc);
    pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
    config_00.type = key_type_numeric_signed;
    config_00.key_size = 4;
    config_00.id = 1;
    config_00.use_type = '\0';
    config_00._5_3_ = 0;
    config_00.value_size = 4;
    config_00.dictionary_size = 100;
    config_00.dictionary_type = dictionary_type_flat_file_t;
    config_00.dictionary_status = '\0';
    config_00._29_3_ = 0;
    FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)pDVar2,config_00);
    pVar1 = planck_unit_assert_int_are_equal
                      (tc,0,(int)(pDVar2->dict).status,0x309,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                      );
    if (pVar1 != '\0') {
      cpp_wrapper_static_open_close(tc,pDVar2,0x2d,0xe);
      pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
      config_01.type = key_type_numeric_signed;
      config_01.key_size = 4;
      config_01.id = 1;
      config_01.use_type = '\0';
      config_01._5_3_ = 0;
      config_01.value_size = 4;
      config_01.dictionary_size = 0xa0;
      config_01.dictionary_type = dictionary_type_open_address_hash_t;
      config_01.dictionary_status = '\0';
      config_01._29_3_ = 0;
      OpenAddressHash<int,_int>::OpenAddressHash((OpenAddressHash<int,_int> *)pDVar2,config_01);
      pVar1 = planck_unit_assert_int_are_equal
                        (tc,0,(int)(pDVar2->dict).status,0x310,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                        );
      if (pVar1 != '\0') {
        cpp_wrapper_static_open_close(tc,pDVar2,3,0xf);
        pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
        config_02.type = key_type_numeric_signed;
        config_02.key_size = 4;
        config_02.id = 1;
        config_02.use_type = '\0';
        config_02._5_3_ = 0;
        config_02.value_size = 4;
        config_02.dictionary_size = 0xa0;
        config_02.dictionary_type = dictionary_type_open_address_file_hash_t;
        config_02.dictionary_status = '\0';
        config_02._29_3_ = 0;
        OpenAddressFileHash<int,_int>::OpenAddressFileHash
                  ((OpenAddressFileHash<int,_int> *)pDVar2,config_02);
        pVar1 = planck_unit_assert_int_are_equal
                          (tc,0,(int)(pDVar2->dict).status,0x316,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                          );
        if (pVar1 != '\0') {
          cpp_wrapper_static_open_close(tc,pDVar2,5,0xc);
          pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
          config_03.type = key_type_numeric_signed;
          config_03.key_size = 4;
          config_03.id = 1;
          config_03.use_type = '\0';
          config_03._5_3_ = 0;
          config_03.value_size = 4;
          config_03.dictionary_size = 100;
          config_03.dictionary_type = dictionary_type_skip_list_t;
          config_03.dictionary_status = '\0';
          config_03._29_3_ = 0;
          SkipList<int,_int>::SkipList((SkipList<int,_int> *)pDVar2,config_03);
          pVar1 = planck_unit_assert_int_are_equal
                            (tc,0,(int)(pDVar2->dict).status,0x31d,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                            );
          if (pVar1 != '\0') {
            cpp_wrapper_static_open_close(tc,pDVar2,1,0xd);
            return;
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_static_create_open_close_all(
	planck_unit_test_t *tc
) {
	Dictionary<int, int> *dictionary;

	ion_dictionary_config_info_t config = {
		.id = 1, .use_type = 0, .type = key_type_numeric_signed, .key_size = sizeof(int), .value_size = sizeof(int), .dictionary_size = 100, .dictionary_type = dictionary_type_bpp_tree_t, .dictionary_status = err_ok
	};

	int type = 0;

	dictionary = BppTree<int, int>::openDictionary(config, type, type);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	cpp_wrapper_static_open_close(tc, dictionary, 66, 12);

	config.dictionary_type	= dictionary_type_flat_file_t;

	dictionary				= FlatFile<int, int>::openDictionary(config, type, type);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	cpp_wrapper_static_open_close(tc, dictionary, 45, 14);

	config.dictionary_size	= 160;
	config.dictionary_type	= dictionary_type_open_address_hash_t;

	dictionary				= OpenAddressHash<int, int>::openDictionary(config, type, type);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	cpp_wrapper_static_open_close(tc, dictionary, 3, 15);

	config.dictionary_type	= dictionary_type_open_address_file_hash_t;

	dictionary				= OpenAddressFileHash<int, int>::openDictionary(config, type, type);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	cpp_wrapper_static_open_close(tc, dictionary, 5, 12);

	config.dictionary_size	= 100;
	config.dictionary_type	= dictionary_type_skip_list_t;

	dictionary				= SkipList<int, int>::openDictionary(config, type, type);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	cpp_wrapper_static_open_close(tc, dictionary, 1, 13);

	/* Uncomment when LinearHash dictionary open memory issue fixed. */
/*	config.dictionary_type = dictionary_type_linear_hash_t; */
/*  */
/*	dictionary = LinearHash<int, int>::openDictionary(config, type, type); */
/*	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status); */
/*	cpp_wrapper_static_open_close(tc, dictionary, 2, 22); */
}